

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmHashmapInsert(jx9_hashmap *pMap,char *zKey,int nKeylen,char *zData,int nLen)

{
  sxi32 sVar1;
  jx9_value *pjStack_b8;
  sxi32 rc;
  jx9_value *pKey;
  jx9_value sValue;
  jx9_value sKey;
  int nLen_local;
  char *zData_local;
  int nKeylen_local;
  char *zKey_local;
  jx9_hashmap *pMap_local;
  
  pjStack_b8 = (jx9_value *)0x0;
  jx9MemObjInit(pMap->pVm,(jx9_value *)&sValue.nIdx);
  jx9MemObjInitFromString(pMap->pVm,(jx9_value *)&pKey,(SyString *)0x0);
  if (zKey != (char *)0x0) {
    zData_local._4_4_ = nKeylen;
    if (nKeylen < 0) {
      zData_local._4_4_ = SyStrlen(zKey);
    }
    jx9MemObjStringAppend((jx9_value *)&sValue.nIdx,zKey,zData_local._4_4_);
    pjStack_b8 = (jx9_value *)&sValue.nIdx;
  }
  if (zData != (char *)0x0) {
    sKey._60_4_ = nLen;
    if (nLen < 0) {
      sKey._60_4_ = SyStrlen(zData);
    }
    jx9MemObjStringAppend((jx9_value *)&pKey,zData,sKey._60_4_);
  }
  sVar1 = jx9HashmapInsert(pMap,pjStack_b8,(jx9_value *)&pKey);
  jx9MemObjRelease((jx9_value *)&sValue.nIdx);
  jx9MemObjRelease((jx9_value *)&pKey);
  return sVar1;
}

Assistant:

static sxi32 VmHashmapInsert(
	jx9_hashmap *pMap,  /* Target hashmap  */
	const char *zKey,   /* Entry key */
	int nKeylen,        /* zKey length*/
	const char *zData,  /* Entry data */
	int nLen            /* zData length */
	)
{
	jx9_value sKey,sValue;
	jx9_value *pKey;
	sxi32 rc;
	pKey = 0;
	jx9MemObjInit(pMap->pVm, &sKey);
	jx9MemObjInitFromString(pMap->pVm, &sValue, 0);
	if( zKey ){
		if( nKeylen < 0 ){
			nKeylen = (int)SyStrlen(zKey);
		}
		jx9MemObjStringAppend(&sKey, zKey, (sxu32)nKeylen);
		pKey = &sKey;
	}
	if( zData ){
		if( nLen < 0 ){
			/* Compute length automatically */
			nLen = (int)SyStrlen(zData);
		}
		jx9MemObjStringAppend(&sValue, zData, (sxu32)nLen);
	}
	/* Perform the insertion */
	rc = jx9HashmapInsert(&(*pMap),pKey,&sValue);
	jx9MemObjRelease(&sKey);
	jx9MemObjRelease(&sValue);
	return rc;
}